

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological_sort.h
# Opt level: O0

void __thiscall
wasm::TopologicalSort<wasm::Name,_DependencySort>::stepToNext
          (TopologicalSort<wasm::Name,_DependencySort> *this)

{
  bool bVar1;
  reference pvVar2;
  IString *this_00;
  undefined1 local_20 [8];
  Name item;
  TopologicalSort<wasm::Name,_DependencySort> *this_local;
  
  item.super_IString.str._M_str = (char *)this;
  do {
    bVar1 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::empty(&this->workStack);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    pvVar2 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::back(&this->workStack);
    local_20 = (undefined1  [8])(pvVar2->super_IString).str._M_len;
    item.super_IString.str._M_len = (size_t)(pvVar2->super_IString).str._M_str;
    ReorderGlobals::run(wasm::Module*)::DependencySort::pushPredecessors(wasm::Name_
              (this,(Name)(pvVar2->super_IString).str);
    this_00 = &std::vector<wasm::Name,_std::allocator<wasm::Name>_>::back(&this->workStack)->
               super_IString;
    bVar1 = IString::operator==(this_00,(IString *)local_20);
  } while (!bVar1);
  return;
}

Assistant:

void stepToNext() {
    while (!workStack.empty()) {
      T item = workStack.back();
      static_cast<Subtype*>(this)->pushPredecessors(item);
      if (workStack.back() == item) {
        // No unfinished predecessors, so this is the next item in the sort.
        break;
      }
    }
  }